

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PushMultiItemsWidths(int components,float w_full)

{
  ImVector<float> *this;
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float w_item_last;
  float w_item_one;
  float local_38;
  float local_34;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  fVar7 = (GImGui->Style).ItemInnerSpacing.x;
  iVar3 = components + -1;
  fVar6 = (float)(int)((w_full - fVar7 * (float)iVar3) / (float)components);
  fVar8 = 1.0;
  if (1.0 <= fVar6) {
    fVar8 = fVar6;
  }
  fVar6 = (float)(int)(w_full - (fVar8 + fVar7) * (float)iVar3);
  fVar7 = 1.0;
  if (1.0 <= fVar6) {
    fVar7 = fVar6;
  }
  _local_38 = CONCAT44(fVar8,fVar7);
  this = &(pIVar1->DC).ItemWidthStack;
  ImVector<float>::push_back(this,&local_38);
  iVar4 = 0;
  if (0 < iVar3) {
    iVar4 = iVar3;
  }
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    ImVector<float>::push_back(this,&local_34);
  }
  (pIVar1->DC).ItemWidth =
       (pIVar1->DC).ItemWidthStack.Data[(long)(pIVar1->DC).ItemWidthStack.Size + -1];
  *(byte *)&(pIVar2->NextItemData).Flags = (byte)(pIVar2->NextItemData).Flags & 0xfe;
  return;
}

Assistant:

void ImGui::PushMultiItemsWidths(int components, float w_full)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiStyle& style = g.Style;
    const float w_item_one  = ImMax(1.0f, IM_FLOOR((w_full - (style.ItemInnerSpacing.x) * (components - 1)) / (float)components));
    const float w_item_last = ImMax(1.0f, IM_FLOOR(w_full - (w_item_one + style.ItemInnerSpacing.x) * (components - 1)));
    window->DC.ItemWidthStack.push_back(w_item_last);
    for (int i = 0; i < components - 1; i++)
        window->DC.ItemWidthStack.push_back(w_item_one);
    window->DC.ItemWidth = window->DC.ItemWidthStack.back();
    g.NextItemData.Flags &= ~ImGuiNextItemDataFlags_HasWidth;
}